

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O1

void __thiscall
tf::ObjectPool<tf::Node,_65536UL>::ObjectPool(ObjectPool<tf::Node,_65536UL> *this,uint t)

{
  long lVar1;
  pointer pLVar2;
  uint uVar3;
  pointer pLVar4;
  Blocklist *pBVar5;
  ulong uVar6;
  long lVar7;
  allocator_type local_9;
  
  if (t * 2 == 0xfffffffe) {
    uVar6 = 0;
  }
  else {
    uVar3 = t * 2 | t & 0x7ffffffe;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    uVar6 = (ulong)(uVar3 >> 0x10 | uVar3 | 1);
  }
  this->_lheap_mask = uVar6;
  (this->_gheap).mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_gheap).mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_gheap).mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->_gheap).mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->_gheap).mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::
  vector<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
  ::vector(&this->_lheaps,uVar6 + 1,&local_9);
  pBVar5 = &(this->_gheap).list;
  (this->_gheap).list.next = pBVar5;
  (this->_gheap).list.prev = pBVar5;
  pLVar4 = (this->_lheaps).
           super__Vector_base<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->_lheaps).
           super__Vector_base<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap,_std::allocator<tf::ObjectPool<tf::Node,_65536UL>::LocalHeap>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pLVar4 != pLVar2) {
    pBVar5 = pLVar4->lists;
    do {
      lVar7 = 0;
      do {
        lVar1 = (long)&pBVar5->prev + lVar7;
        *(long *)((long)&pBVar5->next + lVar7) = lVar1;
        *(long *)((long)&pBVar5->prev + lVar7) = lVar1;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x50);
      pLVar4 = pLVar4 + 1;
      pBVar5 = (Blocklist *)((long)(pBVar5 + 8) + 8);
    } while (pLVar4 != pLVar2);
  }
  return;
}

Assistant:

ObjectPool<T, S>::ObjectPool(unsigned t) :
  //_heap_mask   {(_next_pow2(t) << 1) - 1u},
  //_heap_mask   { _next_pow2(t<<1) - 1u },
  //_heap_mask   {(t << 1) - 1},
  _lheap_mask { _next_pow2((t+1) << 1) - 1 },
  _lheaps     { _lheap_mask + 1 } {

  _blocklist_init_head(&_gheap.list);

  for(auto& h : _lheaps) {
    for(size_t i=0; i<B; ++i) {
      _blocklist_init_head(&h.lists[i]);
    }
  }
}